

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

void * __thiscall
google::protobuf::internal::ExtensionSet::MutableRawRepeatedField(ExtensionSet *this,int number)

{
  Extension *pEVar1;
  LogMessage *pLVar2;
  LogFinisher local_49;
  LogMessage local_48;
  
  pEVar1 = FindOrNull(this,number);
  if (pEVar1 == (Extension *)0x0) {
    LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0x1d9);
    pLVar2 = LogMessage::operator<<(&local_48,"CHECK failed: extension != nullptr: ");
    pLVar2 = LogMessage::operator<<(pLVar2,"Extension not found.");
    LogFinisher::operator=(&local_49,pLVar2);
    LogMessage::~LogMessage(&local_48);
  }
  return (void *)(pEVar1->field_0).int64_t_value;
}

Assistant:

ExtensionSet::Extension* ExtensionSet::FindOrNull(int key) {
  const auto* const_this = this;
  return const_cast<ExtensionSet::Extension*>(const_this->FindOrNull(key));
}